

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImVector_ImDrawIdx_resize(ImVector_ImDrawIdx *self,int new_size)

{
  int new_size_local;
  ImVector_ImDrawIdx *self_local;
  
  ImVector<unsigned_short>::resize(self,new_size);
  return;
}

Assistant:

CIMGUI_API void ImVector_ImDrawIdx_resize(ImVector_ImDrawIdx* self,int new_size)
{
    return self->resize(new_size);
}